

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_socket.c
# Opt level: O0

ssize_t pcp_socket_recvfrom_impl
                  (int sock,void *buf,size_t len,int flags,sockaddr *src_addr,socklen_t *addrlen,
                  sockaddr_in6 *dst_addr)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  pcp_errno pVar4;
  in_pktinfo *local_4c0;
  socklen_t local_4b8;
  in6_addr *__a;
  in6_pktinfo *pktinfo6;
  in_pktinfo *pktinfo;
  cmsghdr *cmsg;
  iovec iov;
  msghdr msg;
  char control_buf [1024];
  ssize_t local_40;
  ssize_t ret;
  socklen_t *addrlen_local;
  sockaddr *src_addr_local;
  int flags_local;
  size_t len_local;
  void *buf_local;
  int sock_local;
  
  memset(&msg.msg_flags,0,0x400);
  cmsg = (cmsghdr *)buf;
  iov.iov_base = (void *)len;
  memset(&iov.iov_len,0,0x38);
  if (addrlen == (socklen_t *)0x0) {
    local_4b8 = 0;
  }
  else {
    local_4b8 = *addrlen;
  }
  msg.msg_name._0_4_ = local_4b8;
  msg._8_8_ = &cmsg;
  msg.msg_iov = (iovec *)0x1;
  msg.msg_iovlen = (size_t)&msg.msg_flags;
  msg.msg_control = (void *)0x400;
  iov.iov_len = (size_t)src_addr;
  local_40 = recvmsg(sock,(msghdr *)&iov.iov_len,0);
  if (0 < local_40) {
    if (msg.msg_control < (void *)0x10) {
      local_4c0 = (in_pktinfo *)0x0;
    }
    else {
      local_4c0 = (in_pktinfo *)msg.msg_iovlen;
    }
    for (pktinfo = local_4c0; pktinfo != (in_pktinfo *)0x0;
        pktinfo = (in_pktinfo *)__cmsg_nxthdr((msghdr *)&iov.iov_len,(cmsghdr *)pktinfo)) {
      if (((pktinfo->ipi_addr).s_addr == 0) && (pktinfo[1].ipi_ifindex == 8)) {
        (dst_addr->sin6_addr).__in6_u.__u6_addr32[0] = 0;
        (dst_addr->sin6_addr).__in6_u.__u6_addr32[1] = 0;
        uVar2 = htonl(0xffff);
        (dst_addr->sin6_addr).__in6_u.__u6_addr32[2] = uVar2;
        (dst_addr->sin6_addr).__in6_u.__u6_addr32[3] = pktinfo[2].ipi_ifindex;
        dst_addr->sin6_scope_id = 0;
        dst_addr->sin6_family = 10;
      }
      if (((pktinfo->ipi_addr).s_addr == 0x29) && (pktinfo[1].ipi_ifindex == 0x32)) {
        (dst_addr->sin6_addr).__in6_u.__u6_addr32[0] = pktinfo[1].ipi_spec_dst.s_addr;
        (dst_addr->sin6_addr).__in6_u.__u6_addr32[1] = pktinfo[1].ipi_addr.s_addr;
        (dst_addr->sin6_addr).__in6_u.__u6_addr32[2] = pktinfo[2].ipi_ifindex;
        (dst_addr->sin6_addr).__in6_u.__u6_addr32[3] = pktinfo[2].ipi_spec_dst.s_addr;
        dst_addr->sin6_family = 10;
        uVar1 = pktinfo[1].ipi_spec_dst.s_addr;
        uVar2 = htonl(0xffc00000);
        uVar3 = htonl(0xfe800000);
        if ((uVar1 & uVar2) == uVar3) {
          dst_addr->sin6_scope_id = pktinfo[2].ipi_addr.s_addr;
        }
        else {
          dst_addr->sin6_scope_id = 0;
        }
      }
    }
  }
  if (local_40 == -1) {
    pVar4 = pcp_get_error();
    if (pVar4 == PCP_ERR_WOULDBLOCK) {
      local_40 = -0xd;
    }
    else {
      local_40 = -5;
    }
  }
  return local_40;
}

Assistant:

static ssize_t pcp_socket_recvfrom_impl(PCP_SOCKET sock, void *buf, size_t len,
                                        int flags, struct sockaddr *src_addr,
                                        socklen_t *addrlen,
                                        struct sockaddr_in6 *dst_addr) {
    ssize_t ret = -1;

#ifndef PCP_SOCKET_IS_VOIDPTR
#if defined(IPV6_PKTINFO) && defined(IP_PKTINFO)
    char control_buf[1024] = {0};

#ifndef WIN32
    struct msghdr msg;
    struct iovec iov;
    struct cmsghdr *cmsg;

    iov.iov_base = buf;
    iov.iov_len = len;

    memset(&msg, 0, sizeof(msg));
    msg.msg_name = src_addr;
    msg.msg_namelen = addrlen ? *addrlen : 0;
    msg.msg_iov = &iov;
    msg.msg_iovlen = 1;
    msg.msg_control = control_buf;
    msg.msg_controllen = sizeof(control_buf);

    // Receive message with IP_PKTINFO
    ret = recvmsg(sock, &msg, 0);

#else // WIN32
    WSAMSG msg;
    WSABUF iov;
    WSACMSGHDR *cmsg;
    iov.buf = buf;
    iov.len = len;

    memset(&msg, 0, sizeof(msg));
    msg.name = (struct sockaddr *)src_addr;
    msg.namelen = addrlen ? *addrlen : 0;
    msg.lpBuffers = &iov;
    msg.dwBufferCount = 1;
    msg.Control.buf = control_buf;
    msg.Control.len = sizeof(control_buf);
    msg.dwFlags = 0;
    // Get WSARecvMsg function pointer
    LPFN_WSARECVMSG WSARecvMsg;
    GUID guid = WSAID_WSARECVMSG;
    DWORD bytesReturned;
    if (WSAIoctl(sock, SIO_GET_EXTENSION_FUNCTION_POINTER, &guid, sizeof(guid),
                 &WSARecvMsg, sizeof(WSARecvMsg), &bytesReturned, NULL,
                 NULL) == SOCKET_ERROR) {
        perror("WSAIoctl failed");
        return 1;
    }

    DWORD bytesReceived;
    if (WSARecvMsg(sock, &msg, &bytesReceived, NULL, NULL) == SOCKET_ERROR) {
        ret = -1;
    } else {
#ifdef _WIN32
        if (bytesReceived > INT32_MAX) {
            ret = -1; // Handle overflow error
        } else {
            ret = (ssize_t)bytesReceived;
        }
#else
        ret = bytesReceived;
#endif
    }
#endif // WIN32

    // Processing control message
    if (ret > 0) {
        for (cmsg = CMSG_FIRSTHDR(&msg); cmsg != NULL;
             cmsg = CMSG_NXTHDR(&msg, cmsg)) {
            if (cmsg->cmsg_level == IPPROTO_IP &&
                cmsg->cmsg_type == IP_PKTINFO) {
                struct in_pktinfo *pktinfo =
                    (struct in_pktinfo *)PCP_CMSG_DATA(cmsg);
                S6_ADDR32(&dst_addr->sin6_addr)[0] = 0;
                S6_ADDR32(&dst_addr->sin6_addr)[1] = 0;
                S6_ADDR32(&dst_addr->sin6_addr)[2] = htonl(0xFFFF);
                S6_ADDR32(&dst_addr->sin6_addr)[3] = pktinfo->ipi_addr.s_addr;
                dst_addr->sin6_scope_id = 0;
                dst_addr->sin6_family = AF_INET6;
            }
            if (cmsg->cmsg_level == IPPROTO_IPV6 &&
                cmsg->cmsg_type == IPV6_PKTINFO) {
                struct in6_pktinfo *pktinfo6 =
                    (struct in6_pktinfo *)PCP_CMSG_DATA(cmsg);
                IPV6_ADDR_COPY(&dst_addr->sin6_addr, &pktinfo6->ipi6_addr);
                dst_addr->sin6_family = AF_INET6;
                if (IN6_IS_ADDR_LINKLOCAL(&pktinfo6->ipi6_addr)) {
                    dst_addr->sin6_scope_id = pktinfo6->ipi6_ifindex;
                } else {
                    dst_addr->sin6_scope_id = 0;
                }
            }
        }
    }
#else  // IPV6_PKTINFO && IP_PKTINFO
    ret = recvfrom(sock, buf, len, flags, src_addr, addrlen);
#endif // IPV6_PKTINFO && IP_PKTINFO
    if (ret == PCP_SOCKET_ERROR) {
        if (pcp_get_error() == PCP_ERR_WOULDBLOCK) {
            ret = PCP_ERR_WOULDBLOCK;
        } else {
            ret = PCP_ERR_RECV_FAILED;
        }
    }
#endif // PCP_SOCKET_IS_VOIDPTR

    return ret;
}